

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_style_item_data *img;
  nk_flags *state;
  nk_vec2 nVar1;
  nk_property nVar2;
  char cVar3;
  nk_hash seed;
  nk_property_kind nVar4;
  nk_panel *pnVar5;
  nk_user_font *pnVar6;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var7;
  double dVar8;
  double dVar9;
  nk_plugin_paste p_Var10;
  undefined8 uVar11;
  nk_property_variant *pnVar12;
  undefined1 auVar13 [16];
  int *piVar14;
  int *piVar15;
  int *piVar16;
  nk_button_behavior behavior;
  nk_widget_layout_states nVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  nk_context *i;
  nk_style_property *pnVar21;
  nk_context *in;
  char *pcVar22;
  nk_command_buffer *pnVar23;
  uint uVar24;
  nk_window *pnVar25;
  int *piVar26;
  uint uVar27;
  nk_color c;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  float fVar33;
  nk_rect r;
  nk_rect b;
  nk_rect b_00;
  nk_rect b_01;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect r_00;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect b_02;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect bounds_02;
  int *local_278;
  char *local_268;
  int num_len;
  undefined8 local_248;
  float fStack_240;
  float fStack_23c;
  int *local_230;
  char *local_228;
  nk_property_variant *local_220;
  nk_rect local_218;
  float local_208;
  float fStack_204;
  undefined8 uStack_200;
  nk_window *local_1f0;
  undefined1 local_1e8 [16];
  int *local_1d0;
  int *local_1c8;
  int *local_1c0;
  nk_hash local_1b4;
  float local_1b0;
  float local_1ac;
  int local_1a8;
  nk_button_behavior local_1a4;
  nk_property_filter local_1a0;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  int *local_178;
  nk_user_font *local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  nk_text local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  float fStack_dc;
  nk_rect bounds;
  char local_b8 [64];
  char dummy_buffer [64];
  
  dummy_state = 0;
  dummy_length = 0;
  dummy_cursor = 0;
  dummy_select_begin = 0;
  dummy_select_end = 0;
  pnVar25 = ctx->current;
  if (pnVar25 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5c54,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  pnVar5 = pnVar25->layout;
  local_220 = variant;
  local_1b0 = inc_per_pixel;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5c55,
                  "void nk_property(struct nk_context *, const char *, struct nk_property_variant *, float, const enum nk_property_filter)"
                 );
  }
  nVar17 = nk_widget(&bounds,ctx);
  if (nVar17 == NK_WIDGET_INVALID) {
    return;
  }
  cVar3 = *name;
  local_1a0 = filter;
  iVar18 = nk_strlen(name);
  if (cVar3 == '#') {
    seed = (pnVar25->property).seq;
    (pnVar25->property).seq = seed + 1;
    local_1b4 = nk_murmur_hash(name,iVar18,seed);
    name = name + 1;
  }
  else {
    local_1b4 = nk_murmur_hash(name,iVar18,0x2a);
  }
  pnVar12 = local_220;
  local_1c0 = &dummy_select_end;
  local_1c8 = &dummy_select_begin;
  local_1d0 = &dummy_cursor;
  local_230 = &dummy_length;
  local_268 = dummy_buffer;
  local_278 = &dummy_state;
  iVar18 = 0;
  if (((pnVar25->property).active != 0) && (iVar18 = 0, local_1b4 == (pnVar25->property).name)) {
    local_268 = (pnVar25->property).buffer;
    local_230 = &(pnVar25->property).length;
    local_1d0 = &(pnVar25->property).cursor;
    local_278 = &(pnVar25->property).state;
    local_1c8 = &(pnVar25->property).select_start;
    local_1c0 = &(pnVar25->property).select_end;
    iVar18 = (pnVar25->property).state;
  }
  (ctx->text_edit).clip.copy = (ctx->clip).copy;
  p_Var10 = (ctx->clip).paste;
  (ctx->text_edit).clip.userdata = (ctx->clip).userdata;
  (ctx->text_edit).clip.paste = p_Var10;
  if ((nVar17 == NK_WIDGET_ROM) && ((pnVar25->property).active == 0)) {
    i = (nk_context *)0x0;
  }
  else {
    i = (nk_context *)0x0;
    if ((pnVar5->flags & 0x1000) == 0) {
      i = ctx;
    }
  }
  pnVar6 = (ctx->style).font;
  local_1a4 = ctx->button_behavior;
  local_148 = bounds.y;
  fStack_240 = bounds.h;
  local_208 = bounds.w;
  fStack_204 = bounds.h;
  uStack_200 = 0;
  local_218.x = bounds.x;
  local_218.y = bounds.y;
  local_218.w = 0.0;
  local_218.h = 0.0;
  local_1e8 = ZEXT416((uint)(pnVar6->height * 0.5));
  local_1ac = (ctx->style).property.border;
  local_138._0_4_ = bounds.x + local_1ac + (ctx->style).property.padding.x;
  uStack_130 = 0;
  fStack_23c = fStack_240;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  local_138._4_4_ = local_148;
  local_248._0_4_ = fStack_240;
  local_248._4_4_ = fStack_240;
  iVar19 = nk_strlen(name);
  pcVar22 = name;
  fVar28 = (*pnVar6->width)(pnVar6->userdata,pnVar6->height,name,iVar19);
  piVar26 = local_230;
  iVar20 = (int)pcVar22;
  fVar30 = (ctx->style).property.border;
  nVar1 = (ctx->style).property.padding;
  fVar29 = nVar1.x;
  fVar33 = nVar1.y;
  local_118 = (float)local_138 + (float)local_1e8._0_4_ + fVar29;
  fStack_114 = fVar30 + local_218.y + fVar33;
  fStack_110 = local_138._4_4_ + local_218.w + 0.0;
  fStack_10c = local_218.h + 0.0 + 0.0;
  local_158 = CONCAT44(fVar33,fVar29 + fVar29 + fVar28);
  uStack_150 = 0;
  local_168 = (float)local_248 - (fVar30 + fVar30 + fVar33 + fVar33);
  local_188 = (local_218.x + local_208) - ((float)local_1e8._0_4_ + fVar29);
  fStack_184 = local_218.y;
  fStack_180 = local_218.w;
  fStack_17c = local_218.h;
  fStack_164 = local_248._4_4_;
  fStack_160 = fStack_240;
  fStack_15c = fStack_23c;
  local_1a8 = iVar19;
  local_170 = pnVar6;
  if (*local_278 == 1) {
    local_e8 = (*pnVar6->width)(pnVar6->userdata,pnVar6->height,local_268,*local_230);
    local_e8 = local_e8 + (ctx->style).property.edit.cursor_size;
    local_228 = local_268;
    local_178 = piVar26;
  }
  else {
    if (pnVar12->kind == NK_PROPERTY_DOUBLE) {
      dVar8 = (pnVar12->value).d;
LAB_00138b4f:
      nk_dtoa(local_b8,dVar8);
      num_len = nk_string_float_limit(local_b8,iVar20);
    }
    else {
      if (pnVar12->kind == NK_PROPERTY_FLOAT) {
        dVar8 = (double)(pnVar12->value).f;
        goto LAB_00138b4f;
      }
      nk_itoa(local_b8,(long)(pnVar12->value).i);
      num_len = nk_strlen(local_b8);
    }
    local_228 = local_b8;
    local_e8 = (*pnVar6->width)(pnVar6->userdata,pnVar6->height,local_228,num_len);
    local_178 = &num_len;
  }
  state = &ctx->last_widget_state;
  fVar30 = (ctx->style).property.border;
  fVar28 = (ctx->style).property.padding.x;
  local_e8 = fVar28 + fVar28 + local_e8;
  uVar11 = CONCAT44(local_168,(float)local_158);
  uStack_150 = CONCAT44(fStack_164,local_158._4_4_);
  fVar29 = local_188 - (local_118 + (float)local_158);
  if (fVar29 <= local_e8) {
    local_e8 = fVar29;
  }
  fVar28 = local_188 - (fVar28 + local_e8);
  fStack_f4 = local_148 + fVar30;
  fStack_f0 = fStack_184;
  fStack_ec = fStack_144;
  fStack_e4 = (float)local_248 - (fVar30 + fVar30);
  uStack_e0 = 0;
  fStack_dc = local_248._4_4_;
  local_168 = (float)*local_278;
  local_1f0 = pnVar25;
  local_158 = uVar11;
  local_f8 = fVar28;
  if (i == (nk_context *)0x0) {
    if (local_168 == 2.8026e-45) {
      uVar27 = *state & 2 | 4;
      *state = uVar27;
LAB_00138e1d:
      pnVar25 = local_1f0;
      if (((uVar27 & 0x10) == 0) ||
         (rect_00.w = local_208, rect_00.h = fStack_204, rect_00.x = local_218.x,
         rect_00.y = local_218.y, iVar19 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_00),
         iVar19 != 0)) goto LAB_00138e88;
      uVar27 = uVar27 | 8;
LAB_00138ea6:
      *state = uVar27;
      goto LAB_00138eae;
    }
  }
  else {
    if (local_168 == 2.8026e-45) {
LAB_00138d48:
      local_128 = (float)(i->input).mouse.buttons[0].down;
      b_01.w = local_208;
      b_01.h = fStack_204;
      b_01.x = local_218.x;
      b_01.y = local_218.y;
      iVar19 = nk_input_has_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_01,1);
      uVar24 = *state & 2 | 4;
      *state = uVar24;
      rect.w = local_208;
      rect.h = fStack_204;
      rect.x = local_218.x;
      rect.y = local_218.y;
      iVar20 = nk_input_is_mouse_hovering_rect(&i->input,rect);
      uVar27 = 0x12;
      if (iVar20 == 0) {
        uVar27 = uVar24;
      }
      *state = uVar27;
      if ((local_128 == 0.0) || (iVar19 == 0)) goto LAB_00138e1d;
      fVar30 = local_1b0 * (i->input).mouse.delta.x;
      nVar4 = local_220->kind;
      if (nVar4 == NK_PROPERTY_DOUBLE) {
        dVar8 = (double)fVar30 + (local_220->value).d;
        if ((local_220->max_value).d <= dVar8) {
          dVar8 = (local_220->max_value).d;
        }
        dVar9 = (local_220->min_value).d;
        if ((local_220->min_value).d <= dVar8) {
          dVar9 = dVar8;
        }
        (local_220->value).d = dVar9;
      }
      else if (nVar4 == NK_PROPERTY_FLOAT) {
        fVar30 = fVar30 + (local_220->value).f;
        if ((local_220->max_value).f <= fVar30) {
          fVar30 = (local_220->max_value).f;
        }
        fVar28 = (local_220->min_value).f;
        if ((local_220->min_value).f <= fVar30) {
          fVar28 = fVar30;
        }
        (local_220->value).f = fVar28;
      }
      else if (nVar4 == NK_PROPERTY_INT) {
        iVar19 = (int)fVar30 + (local_220->value).i;
        if ((local_220->max_value).i <= iVar19) {
          iVar19 = (local_220->max_value).i;
        }
        if (iVar19 <= (local_220->min_value).i) {
          iVar19 = (local_220->min_value).i;
        }
        (local_220->value).i = iVar19;
      }
      *state = 0x22;
      uVar27 = 0x22;
      pnVar25 = local_1f0;
LAB_00138e88:
      rect_01.w = local_208;
      rect_01.h = fStack_204;
      rect_01.x = local_218.x;
      rect_01.y = local_218.y;
      iVar19 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_01);
      if (iVar19 != 0) {
        uVar27 = uVar27 | 0x40;
        goto LAB_00138ea6;
      }
LAB_00138eae:
      iVar19 = 0;
      if ((uVar27 & 0x20) != 0) goto LAB_00138ebd;
    }
    else {
      if (local_168 != 0.0) goto LAB_00138ebd;
      fStack_124 = fStack_114;
      fStack_120 = fStack_110;
      fStack_11c = fStack_10c;
      r.y = fStack_f4;
      r.x = fVar28;
      r.h = fStack_e4;
      r.w = local_e8;
      local_128 = local_118 + (float)local_158;
      iVar19 = nk_button_behavior(state,r,&i->input,NK_BUTTON_DEFAULT);
      if (iVar19 == 0) {
        b.y = fStack_114;
        b.x = local_118;
        b.w = (float)local_158;
        b.h = (float)local_158._4_4_;
        iVar19 = nk_input_is_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b,1);
        if (iVar19 == 0) {
          b_00.y = local_218.y;
          b_00.x = local_128;
          b_00.h = fStack_204;
          b_00.w = fVar28 - local_128;
          iVar19 = nk_input_is_mouse_click_down_in_rect(&i->input,NK_BUTTON_LEFT,b_00,1);
          if (iVar19 == 0) {
            if (*local_278 == 2) goto LAB_00138d48;
            goto LAB_00138ebd;
          }
        }
        *local_278 = 2;
        goto LAB_00138d48;
      }
      iVar19 = 1;
    }
    *local_278 = iVar19;
  }
LAB_00138ebd:
  local_148 = local_148 + local_1ac;
  local_248._0_4_ = (float)local_248 * 0.5;
  pnVar23 = &pnVar25->buffer;
  p_Var7 = (ctx->style).property.draw_begin;
  if (p_Var7 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var7)(pnVar23,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  if ((*state & 0x20) == 0) {
    if ((*state & 0x10) == 0) {
      pnVar21 = &(ctx->style).property;
      local_108.text = (ctx->style).property.label_normal;
    }
    else {
      pnVar21 = (nk_style_property *)&(ctx->style).property.hover;
      local_108.text = (ctx->style).property.label_hover;
    }
  }
  else {
    pnVar21 = (nk_style_property *)&(ctx->style).property.active;
    local_108.text = (ctx->style).property.label_active;
  }
  local_248 = (nk_command_buffer *)
              CONCAT44(local_248._4_4_,((float)local_248 + local_148) - (float)local_1e8._0_4_ * 0.5
                      );
  img = &(pnVar21->normal).data;
  if ((pnVar21->normal).type == NK_STYLE_ITEM_IMAGE) {
    r_00.w = local_208;
    r_00.h = fStack_204;
    r_00.x = local_218.x;
    r_00.y = local_218.y;
    nk_draw_image(pnVar23,r_00,&img->image,(nk_color)0xffffffff);
    c.r = '\0';
    c.g = '\0';
    c.b = '\0';
    c.a = '\0';
  }
  else {
    c = img->color;
    rect_02.w = local_208;
    rect_02.h = fStack_204;
    rect_02.x = local_218.x;
    rect_02.y = local_218.y;
    nk_fill_rect(pnVar23,rect_02,(ctx->style).property.rounding,c);
    rect_03.w = local_208;
    rect_03.h = fStack_204;
    rect_03.x = local_218.x;
    rect_03.y = local_218.y;
    nk_stroke_rect(pnVar23,rect_03,(ctx->style).property.rounding,(ctx->style).property.border,
                   img->color);
  }
  fVar30 = local_138._4_4_;
  pnVar6 = local_170;
  local_1e8._4_4_ = local_1e8._0_4_;
  local_1e8._8_4_ = local_1e8._0_4_;
  local_1e8._12_4_ = local_1e8._0_4_;
  local_138 = CONCAT44((float)local_248,(float)local_138);
  uStack_130 = CONCAT44(local_248._4_4_,fVar30);
  local_108.padding.x = 0.0;
  local_108.padding.y = 0.0;
  b_02.y = fStack_114;
  b_02.x = local_118;
  b_02.w = (float)local_158;
  b_02.h = (float)local_158._4_4_;
  local_108.background = c;
  nk_widget_text(pnVar23,b_02,name,local_1a8,&local_108,0x12,local_170);
  behavior = local_1a4;
  p_Var7 = (ctx->style).property.draw_end;
  if (p_Var7 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var7)(pnVar23,(nk_handle)(ctx->style).property.userdata.ptr);
  }
  fStack_180 = fStack_184;
  auVar13 = local_1e8;
  fStack_184 = (float)local_248;
  fStack_17c = local_248._4_4_;
  bounds_00.w = (float)local_1e8._0_4_;
  bounds_00.h = (float)local_1e8._4_4_;
  bounds_00.x = (float)local_138;
  bounds_00.y = local_138._4_4_;
  local_248 = pnVar23;
  local_1e8 = auVar13;
  iVar19 = nk_do_button_symbol(state,pnVar23,bounds_00,(ctx->style).property.sym_left,behavior,
                               &(ctx->style).property.dec_button,&i->input,pnVar6);
  piVar26 = local_178;
  auVar13 = local_1e8;
  pnVar12 = local_220;
  if (iVar19 != 0) {
    nVar4 = local_220->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      dVar8 = (local_220->value).d - (local_220->step).d;
      if ((local_220->max_value).d <= dVar8) {
        dVar8 = (local_220->max_value).d;
      }
      dVar9 = (local_220->min_value).d;
      if ((local_220->min_value).d <= dVar8) {
        dVar9 = dVar8;
      }
      (local_220->value).d = dVar9;
    }
    else if (nVar4 == NK_PROPERTY_FLOAT) {
      fVar30 = (local_220->value).f - (local_220->step).f;
      if ((local_220->max_value).f <= fVar30) {
        fVar30 = (local_220->max_value).f;
      }
      fVar28 = (local_220->min_value).f;
      if ((local_220->min_value).f <= fVar30) {
        fVar28 = fVar30;
      }
      (local_220->value).f = fVar28;
    }
    else if (nVar4 == NK_PROPERTY_INT) {
      iVar19 = (local_220->value).i - (local_220->step).i;
      if ((local_220->max_value).i <= iVar19) {
        iVar19 = (local_220->max_value).i;
      }
      if (iVar19 <= (local_220->min_value).i) {
        iVar19 = (local_220->min_value).i;
      }
      (local_220->value).i = iVar19;
    }
  }
  bounds_01.y = fStack_184;
  bounds_01.x = local_188;
  bounds_01.w = (float)local_1e8._0_4_;
  bounds_01.h = (float)local_1e8._4_4_;
  local_1e8 = auVar13;
  iVar19 = nk_do_button_symbol(state,local_248,bounds_01,(ctx->style).property.sym_right,behavior,
                               &(ctx->style).property.inc_button,&i->input,pnVar6);
  if (iVar19 != 0) {
    nVar4 = pnVar12->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      dVar8 = (pnVar12->value).d + (pnVar12->step).d;
      if ((pnVar12->max_value).d <= dVar8) {
        dVar8 = (pnVar12->max_value).d;
      }
      dVar9 = (pnVar12->min_value).d;
      if ((pnVar12->min_value).d <= dVar8) {
        dVar9 = dVar8;
      }
      (pnVar12->value).d = dVar9;
    }
    else if (nVar4 == NK_PROPERTY_FLOAT) {
      fVar30 = (pnVar12->value).f + (pnVar12->step).f;
      if ((pnVar12->max_value).f <= fVar30) {
        fVar30 = (pnVar12->max_value).f;
      }
      fVar28 = (pnVar12->min_value).f;
      if ((pnVar12->min_value).f <= fVar30) {
        fVar28 = fVar30;
      }
      (pnVar12->value).f = fVar28;
    }
    else if (nVar4 == NK_PROPERTY_INT) {
      iVar19 = (pnVar12->step).i + (pnVar12->value).i;
      if ((pnVar12->max_value).i <= iVar19) {
        iVar19 = (pnVar12->max_value).i;
      }
      if (iVar19 <= (pnVar12->min_value).i) {
        iVar19 = (pnVar12->min_value).i;
      }
      (pnVar12->value).i = iVar19;
    }
  }
  if (*local_278 == 1 && local_168 != 1.4013e-45) {
    nk_memcopy(local_268,local_228,(long)*piVar26);
    iVar19 = nk_utf_len(local_268,*piVar26);
    *local_1d0 = iVar19;
    *local_230 = *piVar26;
    local_228 = local_268;
    uVar27 = 0;
    piVar26 = local_230;
  }
  else {
    uVar27 = (uint)(*local_278 == 1);
  }
  piVar14 = local_1d0;
  local_1e8._0_8_ = (&PTR_nk_filter_decimal_00195cf0)[local_1a0];
  nk_textedit_clear_state
            (&ctx->text_edit,NK_TEXT_EDIT_SINGLE_LINE,
             (nk_plugin_filter)(&PTR_nk_filter_decimal_00195cf0)[local_1a0]);
  piVar16 = local_1c0;
  piVar15 = local_1c8;
  (ctx->text_edit).active = (uchar)uVar27;
  iVar19 = *piVar26;
  (ctx->text_edit).string.len = iVar19;
  if (*piVar14 < iVar19) {
    iVar19 = *piVar14;
  }
  iVar20 = 0;
  if (iVar19 < 1) {
    iVar19 = iVar20;
  }
  (ctx->text_edit).cursor = iVar19;
  iVar19 = *piVar26;
  if (*local_1c8 < *piVar26) {
    iVar19 = *local_1c8;
  }
  if (iVar19 < 1) {
    iVar19 = iVar20;
  }
  (ctx->text_edit).select_start = iVar19;
  iVar19 = *piVar26;
  if (*local_1c0 < *piVar26) {
    iVar19 = *local_1c0;
  }
  if (iVar19 < 1) {
    iVar19 = iVar20;
  }
  (ctx->text_edit).select_end = iVar19;
  (ctx->text_edit).string.buffer.allocated = (long)*piVar26;
  (ctx->text_edit).string.buffer.memory.size = 0x40;
  (ctx->text_edit).string.buffer.memory.ptr = local_228;
  (ctx->text_edit).string.buffer.size = 0x40;
  (ctx->text_edit).mode = '\x01';
  in = (nk_context *)0x0;
  if (*local_278 == 1) {
    in = i;
  }
  bounds_02.y = fStack_f4;
  bounds_02.x = local_f8;
  bounds_02.h = fStack_e4;
  bounds_02.w = local_e8;
  pnVar23 = local_248;
  local_188 = (float)uVar27;
  nk_do_edit(state,local_248,bounds_02,0x262,(nk_plugin_filter)local_1e8._0_8_,&ctx->text_edit,
             &(ctx->style).property.edit,&in->input,local_170);
  pnVar12 = local_220;
  iVar19 = (int)pnVar23;
  *piVar26 = (ctx->text_edit).string.len;
  *piVar14 = (ctx->text_edit).cursor;
  *piVar15 = (ctx->text_edit).select_start;
  *piVar16 = (ctx->text_edit).select_end;
  if ((ctx->text_edit).active != '\0') {
    iVar19 = 4;
    iVar20 = nk_input_is_key_pressed(&i->input,NK_KEY_ENTER);
    if (iVar20 == 0) goto LAB_00139491;
    (ctx->text_edit).active = '\0';
  }
  if (local_188 != 0.0) {
    *local_278 = 0;
    local_268[*local_230] = '\0';
    nVar4 = pnVar12->kind;
    if (nVar4 == NK_PROPERTY_DOUBLE) {
      nk_string_float_limit(local_268,iVar19);
      dVar8 = nk_strtod(local_268,(char **)0x0);
      iVar19 = SUB84(dVar8,0);
      uVar31 = (undefined4)((ulong)dVar8 >> 0x20);
      nVar2 = pnVar12->max_value;
      if (nVar2.d <= dVar8) {
        iVar19 = nVar2.i;
        uVar31 = nVar2._4_4_;
      }
      nVar2 = pnVar12->min_value;
      iVar20 = nVar2.i;
      uVar32 = nVar2._4_4_;
      if (nVar2.d <= (double)CONCAT44(uVar31,iVar19)) {
        iVar20 = iVar19;
        uVar32 = uVar31;
      }
      nVar2._4_4_ = uVar32;
      nVar2.i = iVar20;
      pnVar12->value = nVar2;
    }
    else if (nVar4 == NK_PROPERTY_FLOAT) {
      nk_string_float_limit(local_268,iVar19);
      fVar30 = nk_strtof(local_268,(char **)0x0);
      if ((pnVar12->max_value).f <= fVar30) {
        fVar30 = (pnVar12->max_value).f;
      }
      fVar28 = (pnVar12->min_value).f;
      if ((pnVar12->min_value).f <= fVar30) {
        fVar28 = fVar30;
      }
      (pnVar12->value).f = fVar28;
    }
    else if (nVar4 == NK_PROPERTY_INT) {
      iVar20 = nk_strtoi(local_268,(char **)0x0);
      iVar19 = (pnVar12->max_value).i;
      if (iVar20 < (pnVar12->max_value).i) {
        iVar19 = iVar20;
      }
      if (iVar19 <= (pnVar12->min_value).i) {
        iVar19 = (pnVar12->min_value).i;
      }
      (pnVar12->value).i = iVar19;
    }
  }
LAB_00139491:
  pnVar25 = local_1f0;
  piVar26 = local_230;
  iVar19 = *local_278;
  if (i != (nk_context *)0x0) {
    if (iVar19 == 0) {
      iVar19 = 0;
    }
    else {
      if ((local_1f0->property).active != 0) {
        return;
      }
      (local_1f0->property).active = 1;
      nk_memcopy((local_1f0->property).buffer,local_268,(long)*local_230);
      (pnVar25->property).length = *piVar26;
      (pnVar25->property).cursor = *piVar14;
      iVar19 = *local_278;
      (pnVar25->property).state = iVar19;
      (pnVar25->property).name = local_1b4;
      (pnVar25->property).select_start = *local_1c8;
      (pnVar25->property).select_end = *local_1c0;
      if (iVar19 == 2) {
        (ctx->input).mouse.grab = '\x01';
        (ctx->input).mouse.grabbed = '\x01';
        return;
      }
    }
  }
  if (iVar18 != 0 && iVar19 == 0) {
    if (iVar18 == 2) {
      (ctx->input).mouse.grab = '\0';
      (ctx->input).mouse.grabbed = '\0';
      (ctx->input).mouse.ungrab = '\x01';
    }
    (pnVar25->property).select_start = 0;
    (pnVar25->property).select_end = 0;
    (pnVar25->property).active = 0;
  }
  return;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
    float inc_per_pixel, const enum nk_property_filter filter)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    struct nk_rect bounds;
    enum nk_widget_layout_states s;

    int *state = 0;
    nk_hash hash = 0;
    char *buffer = 0;
    int *len = 0;
    int *cursor = 0;
    int *select_begin = 0;
    int *select_end = 0;
    int old_state;

    char dummy_buffer[NK_MAX_NUMBER_BUFFER];
    int dummy_state = NK_PROPERTY_DEFAULT;
    int dummy_length = 0;
    int dummy_cursor = 0;
    int dummy_select_begin = 0;
    int dummy_select_end = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    s = nk_widget(&bounds, ctx);
    if (!s) return;

    /* calculate hash from name */
    if (name[0] == '#') {
        hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
        name++; /* special number hash */
    } else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

    /* check if property is currently hot item */
    if (win->property.active && hash == win->property.name) {
        buffer = win->property.buffer;
        len = &win->property.length;
        cursor = &win->property.cursor;
        state = &win->property.state;
        select_begin = &win->property.select_start;
        select_end = &win->property.select_end;
    } else {
        buffer = dummy_buffer;
        len = &dummy_length;
        cursor = &dummy_cursor;
        state = &dummy_state;
        select_begin =  &dummy_select_begin;
        select_end = &dummy_select_end;
    }

    /* execute property widget */
    old_state = *state;
    ctx->text_edit.clip = ctx->clip;
    in = ((s == NK_WIDGET_ROM && !win->property.active) ||
        layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
        variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
        select_end, &style->property, filter, in, style->font, &ctx->text_edit,
        ctx->button_behavior);

    if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
        /* current property is now hot */
        win->property.active = 1;
        NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
        win->property.length = *len;
        win->property.cursor = *cursor;
        win->property.state = *state;
        win->property.name = hash;
        win->property.select_start = *select_begin;
        win->property.select_end = *select_end;
        if (*state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_true;
            ctx->input.mouse.grabbed = nk_true;
        }
    }
    /* check if previously active property is now inactive */
    if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
        if (old_state == NK_PROPERTY_DRAG) {
            ctx->input.mouse.grab = nk_false;
            ctx->input.mouse.grabbed = nk_false;
            ctx->input.mouse.ungrab = nk_true;
        }
        win->property.select_start = 0;
        win->property.select_end = 0;
        win->property.active = 0;
    }
}